

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::resize(Plotter *this,int width,int height)

{
  double dVar1;
  double dVar2;
  double hf;
  double wf;
  int height_local;
  int width_local;
  Plotter *this_local;
  
  dVar1 = (((this->view).xmax - (this->view).xmin) *
          (((double)width * 1.0) / (double)(this->view).swid - 1.0)) / 2.0;
  dVar2 = (((this->view).ymax - (this->view).ymin) *
          (((double)height * 1.0) / (double)(this->view).shigh - 1.0)) / 2.0;
  (this->view).xmax = dVar1 + (this->view).xmax;
  (this->view).xmin = (this->view).xmin - dVar1;
  (this->view).ymax = dVar2 + (this->view).ymax;
  (this->view).ymin = (this->view).ymin - dVar2;
  (this->view).swid = width;
  (this->view).shigh = height;
  this->require_update = true;
  return;
}

Assistant:

void Plotter::resize(int width, int height) {
    double wf = (view.xmax - view.xmin) * (1.*width / view.swid - 1.) / 2;
    double hf = (view.ymax - view.ymin) * (1.*height / view.shigh - 1.) / 2;
    view.xmax += wf; view.xmin -= wf;
    view.ymax += hf; view.ymin -= hf;

    view.swid = width;
    view.shigh = height;
    require_update = true;
}